

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PowerGenerator.cc
# Opt level: O0

void __thiscall InputParser::InputParser(InputParser *this,istream *in)

{
  size_t in_RCX;
  void *__buf;
  int __fd;
  istream *in_local;
  InputParser *this_local;
  
  __fd = (int)in;
  this->stream = in;
  std::__cxx11::string::string((string *)&this->str);
  this->good = true;
  this->lineno = 0;
  this->oldLineno = 1;
  read(this,__fd,__buf,in_RCX);
  return;
}

Assistant:

InputParser::InputParser(std::istream& in)
    : stream(in), good(true), lineno(0), oldLineno(1)
{
    read();
}